

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_a90d9::pixelArray::pixelArray(pixelArray *this,int height,int width)

{
  void *pvVar1;
  uint *puVar2;
  float *pfVar3;
  half *phVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar7 = (long)height;
  lVar8 = (long)width;
  (this->i)._sizeX = lVar7;
  (this->i)._sizeY = lVar8;
  uVar10 = lVar8 * lVar7;
  uVar9 = -(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4;
  puVar2 = (uint *)operator_new__(uVar9);
  (this->i)._data = puVar2;
  (this->f)._sizeX = lVar7;
  (this->f)._sizeY = lVar8;
  pfVar3 = (float *)operator_new__(uVar9);
  (this->f)._data = pfVar3;
  (this->h)._sizeX = lVar7;
  (this->h)._sizeY = lVar8;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)uVar10) {
    uVar9 = uVar10 * 2;
  }
  phVar4 = (half *)operator_new__(uVar9);
  (this->h)._data = phVar4;
  this->rgba[0]._sizeX = 0;
  this->rgba[0]._sizeY = 0;
  this->rgba[0]._data = (half *)0x0;
  this->rgba[1]._sizeX = 0;
  this->rgba[1]._sizeY = 0;
  this->rgba[1]._data = (half *)0x0;
  this->rgba[2]._sizeX = 0;
  this->rgba[2]._sizeY = 0;
  this->rgba[2]._data = (half *)0x0;
  this->rgba[3]._sizeX = 0;
  this->rgba[3]._sizeY = 0;
  this->rgba[3]._data = (half *)0x0;
  lVar6 = 0;
  do {
    pvVar5 = operator_new__(uVar9);
    pvVar1 = *(void **)((long)&this->rgba[0]._data + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    *(long *)((long)&this->rgba[0]._sizeX + lVar6) = lVar7;
    *(long *)((long)&this->rgba[0]._sizeY + lVar6) = lVar8;
    *(void **)((long)&this->rgba[0]._data + lVar6) = pvVar5;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x60);
  return;
}

Assistant:

pixelArray (int height, int width)
        : i (height, width), f (height, width), h (height, width)
    {
        for (int c = 0; c < 4; ++c)
        {
            rgba[c].resizeErase (height, width);
        }
    }